

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandBidec(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk;
  uint fVerbose;
  char *pcVar2;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  fVerbose = 0;
  Extra_UtilGetoptReset();
  while (iVar1 = Extra_UtilGetopt(argc,argv,"vh"), iVar1 == 0x76) {
    fVerbose = fVerbose ^ 1;
  }
  if (iVar1 == -1) {
    if (pNtk == (Abc_Ntk_t *)0x0) {
      pcVar2 = "Empty network.\n";
    }
    else {
      if ((pNtk->ntkFunc == ABC_FUNC_AIG) && (pNtk->ntkType == ABC_NTK_LOGIC)) {
        Abc_NtkBidecResyn(pNtk,fVerbose);
        return 0;
      }
      pcVar2 = "Bi-decomposition only works when node functions are AIGs (run \"aig\").\n";
    }
    iVar1 = -1;
  }
  else {
    Abc_Print(-2,"usage: bidec [-vh]\n");
    Abc_Print(-2,"\t         applies bi-decomposition to local functions of the nodes\n");
    pcVar2 = "yes";
    if (fVerbose == 0) {
      pcVar2 = "no";
    }
    Abc_Print(-2,"\t-v     : prints verbose information [default = %s]\n",pcVar2);
    pcVar2 = "\t-h     : print the command usage\n";
    iVar1 = -2;
  }
  Abc_Print(iVar1,pcVar2);
  return 1;
}

Assistant:

int Abc_CommandBidec( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    int fVerbose;
    extern void Abc_NtkBidecResyn( Abc_Ntk_t * pNtk, int fVerbose );

    // set defaults
    fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    // get the new network
    if ( !Abc_NtkIsAigLogic(pNtk) )
    {
        Abc_Print( -1, "Bi-decomposition only works when node functions are AIGs (run \"aig\").\n" );
        return 1;
    }
    Abc_NtkBidecResyn( pNtk, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: bidec [-vh]\n" );
    Abc_Print( -2, "\t         applies bi-decomposition to local functions of the nodes\n" );
    Abc_Print( -2, "\t-v     : prints verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}